

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O3

FT_Error afm_parser_parse(AFM_Parser parser)

{
  AFM_FontInfo pAVar1;
  FT_Memory memory;
  AFM_FontInfo pAVar2;
  long lVar3;
  FT_Offset FVar4;
  int iVar5;
  AFM_Token AVar6;
  FT_Int FVar7;
  char *pcVar8;
  AFM_KernPair pAVar9;
  undefined4 extraout_var;
  AFM_TrackKern pAVar10;
  long lVar11;
  uint uVar12;
  FT_Offset *in_RDX;
  FT_Offset *len_00;
  FT_Offset *len_01;
  FT_Offset *extraout_RDX;
  FT_Offset *extraout_RDX_00;
  FT_Offset *extraout_RDX_01;
  FT_Offset *extraout_RDX_02;
  FT_Offset *extraout_RDX_03;
  FT_Offset *extraout_RDX_04;
  FT_Offset *extraout_RDX_05;
  FT_Offset *extraout_RDX_06;
  FT_Offset *extraout_RDX_07;
  FT_Offset *extraout_RDX_08;
  FT_Offset *extraout_RDX_09;
  FT_Offset *pFVar13;
  FT_Offset *extraout_RDX_10;
  FT_Offset *extraout_RDX_11;
  FT_Offset *extraout_RDX_12;
  FT_Offset *extraout_RDX_13;
  FT_Offset *extraout_RDX_14;
  AFM_ValueType_ AVar14;
  AFM_ValueType_ AVar15;
  undefined1 local_f8 [8];
  AFM_ValueRec shared_vals [4];
  FT_Offset local_b0;
  AFM_ValueType_ local_a8;
  undefined4 uStack_a4;
  FT_Offset len_1;
  undefined4 local_98;
  FT_UInt local_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  uint local_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  uint local_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined8 local_60;
  FT_Offset local_50;
  FT_Offset len;
  FT_Offset len_2;
  ulong local_38;
  
  pAVar1 = parser->FontInfo;
  if (pAVar1 == (AFM_FontInfo)0x0) {
    AVar14 = AFM_VALUE_TYPE_BOOL|AFM_VALUE_TYPE_FIXED;
  }
  else {
    memory = parser->memory;
    pcVar8 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_50,in_RDX);
    AVar14 = AFM_VALUE_TYPE_FIXED;
    if (((pcVar8 != (char *)0x0) && (local_50 == 0x10)) &&
       (iVar5 = strncmp(pcVar8,"StartFontMetrics",0x10), iVar5 == 0)) {
      pcVar8 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_50,len_00);
      AVar14 = 0xa0;
      if (pcVar8 != (char *)0x0) {
        do {
          AVar6 = afm_tokenize(pcVar8,local_50);
          pFVar13 = len_01;
          if ((int)AVar6 < 0x1e) {
            if ((int)AVar6 < 0x14) {
              if (AVar6 == AFM_TOKEN_ASCENDER) {
                local_f8._0_4_ = AFM_VALUE_TYPE_FIXED;
                FVar7 = afm_parser_read_vals(parser,(AFM_Value)local_f8,1);
                if (FVar7 != 1) break;
                pAVar1->Ascender = CONCAT71(shared_vals[0]._1_7_,(undefined1)shared_vals[0].type);
                pFVar13 = extraout_RDX_05;
              }
              else if (AVar6 == AFM_TOKEN_DESCENDER) {
                local_f8._0_4_ = AFM_VALUE_TYPE_FIXED;
                FVar7 = afm_parser_read_vals(parser,(AFM_Value)local_f8,1);
                if (FVar7 != 1) break;
                pAVar1->Descender = CONCAT71(shared_vals[0]._1_7_,(undefined1)shared_vals[0].type);
                pFVar13 = extraout_RDX;
              }
            }
            else if (AVar6 == AFM_TOKEN_FONTBBOX) {
              local_f8._0_4_ = AFM_VALUE_TYPE_FIXED;
              shared_vals[0].u.i = 2;
              shared_vals[1].u.i = 2;
              shared_vals[2].u.i = 2;
              FVar7 = afm_parser_read_vals(parser,(AFM_Value)local_f8,4);
              if (FVar7 != 4) break;
              (pAVar1->FontBBox).xMin =
                   CONCAT71(shared_vals[0]._1_7_,(undefined1)shared_vals[0].type);
              (pAVar1->FontBBox).yMin = shared_vals[1]._0_8_;
              (pAVar1->FontBBox).xMax = shared_vals[2]._0_8_;
              (pAVar1->FontBBox).yMax = shared_vals[3]._0_8_;
              pFVar13 = extraout_RDX_01;
            }
            else if (AVar6 == AFM_TOKEN_ENDFONTMETRICS) {
              return 0;
            }
          }
          else if ((int)AVar6 < 0x2d) {
            if (AVar6 == AFM_TOKEN_ISCIDFONT) {
              local_f8._0_4_ = AFM_VALUE_TYPE_BOOL;
              FVar7 = afm_parser_read_vals(parser,(AFM_Value)local_f8,1);
              if (FVar7 != 1) break;
              pAVar1->IsCIDFont = (undefined1)shared_vals[0].type;
              pFVar13 = extraout_RDX_06;
            }
            else if (AVar6 == AFM_TOKEN_METRICSSETS) {
              local_a8 = AFM_VALUE_TYPE_INTEGER;
              FVar7 = afm_parser_read_vals(parser,(AFM_Value)&stack0xffffffffffffff58,1);
              if (FVar7 != 1) break;
              pFVar13 = extraout_RDX_00;
              if (((FT_UInt)len_1 & 0xfffffffd) != 0) {
                AVar14 = AFM_VALUE_TYPE_BOOL|AFM_VALUE_TYPE_INTEGER;
                break;
              }
            }
          }
          else if (AVar6 == AFM_TOKEN_STARTCHARMETRICS) {
            local_a8 = AFM_VALUE_TYPE_INTEGER;
            FVar7 = afm_parser_read_vals(parser,(AFM_Value)&stack0xffffffffffffff58,1);
            if (FVar7 != 1) break;
            iVar5 = (FT_UInt)len_1 + 1;
            pFVar13 = extraout_RDX_02;
            while (iVar5 = iVar5 + -1, 0 < iVar5) {
              pcVar8 = afm_parser_next_key((AFM_Parser)parser->stream,'\0',pFVar13);
              pFVar13 = extraout_RDX_03;
              if (pcVar8 == (char *)0x0) {
                return 0xa0;
              }
            }
            do {
              pcVar8 = afm_parser_next_key((AFM_Parser)parser->stream,
                                           (FT_Bool)(AFM_Value)&stack0xffffffffffffff58,pFVar13);
              if (pcVar8 == (char *)0x0) {
                return 0xa0;
              }
              AVar6 = afm_tokenize(pcVar8,CONCAT44(uStack_a4,local_a8));
            } while ((AVar6 != AFM_TOKEN_ENDCHARMETRICS) &&
                    (pFVar13 = extraout_RDX_04, AVar6 != AFM_TOKEN_ENDFONTMETRICS));
            AVar14 = AFM_VALUE_TYPE_STRING;
            pFVar13 = extraout_RDX_04;
          }
          else if (AVar6 == AFM_TOKEN_STARTKERNDATA) {
            pcVar8 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_b0,len_01);
            AVar15 = 0xa0;
            goto LAB_00209464;
          }
          pcVar8 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_50,pFVar13);
        } while (pcVar8 != (char *)0x0);
      }
LAB_002093f9:
      ft_mem_free(memory,pAVar1->TrackKerns);
      pAVar1->TrackKerns = (AFM_TrackKern)0x0;
      pAVar1->NumTrackKern = 0;
      ft_mem_free(memory,pAVar1->KernPairs);
      pAVar1->KernPairs = (AFM_KernPair)0x0;
      pAVar1->NumKernPair = 0;
      pAVar1->IsCIDFont = '\0';
    }
  }
  return AVar14;
LAB_00209464:
  AVar14 = AVar15;
  if (pcVar8 == (char *)0x0) goto LAB_002093f9;
  AVar6 = afm_tokenize(pcVar8,local_b0);
  if ((int)AVar6 < 0x35) {
    if (1 < AVar6 - AFM_TOKEN_STARTKERNPAIRS) {
      if (AVar6 - AFM_TOKEN_ENDFONTMETRICS < 2) {
        return 0;
      }
      goto LAB_002093f9;
    }
    pAVar2 = parser->FontInfo;
    local_a8 = AFM_VALUE_TYPE_INTEGER;
    FVar7 = afm_parser_read_vals(parser,(AFM_Value)&stack0xffffffffffffff58,1);
    if ((FVar7 == 1) && (-1 < (long)(int)(FT_UInt)len_1)) {
      pAVar2->NumKernPair = (FT_UInt)len_1;
      pFVar13 = extraout_RDX_08;
      if ((FT_UInt)len_1 != 0) {
        pAVar9 = (AFM_KernPair)
                 ft_mem_realloc(parser->memory,0x10,0,(long)(int)(FT_UInt)len_1,(void *)0x0,
                                (FT_Error *)&stack0xffffffffffffff58);
        pAVar2->KernPairs = pAVar9;
        pFVar13 = extraout_RDX_09;
        AVar14 = local_a8;
        if (local_a8 != AFM_VALUE_TYPE_STRING) goto LAB_002093f9;
      }
      pcVar8 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&len,pFVar13);
      if (pcVar8 != (char *)0x0) {
        local_38 = 0xffffffff;
        do {
          AVar6 = afm_tokenize(pcVar8,len);
          pFVar13 = (FT_Offset *)(ulong)(AVar6 - AFM_TOKEN_ENDFONTMETRICS);
          if (0x37 < AVar6 - AFM_TOKEN_ENDFONTMETRICS) break;
          if ((0x34000UL >> ((ulong)pFVar13 & 0x3f) & 1) == 0) {
            if (pFVar13 != (FT_Offset *)0x37) goto LAB_00209799;
          }
          else {
            uVar12 = (int)local_38 + 1;
            len_2 = CONCAT44(extraout_var,AVar6);
            if ((int)pAVar2->NumKernPair <= (int)uVar12) break;
            pAVar9 = pAVar2->KernPairs + (int)uVar12;
            local_a8 = AFM_VALUE_TYPE_INDEX;
            local_98 = 5;
            local_88 = 3;
            local_78 = 3;
            local_38 = (ulong)uVar12;
            FVar7 = afm_parser_read_vals(parser,(AFM_Value)&stack0xffffffffffffff58,4);
            if (FVar7 < 3) break;
            pAVar9->index1 = (FT_UInt)len_1;
            pAVar9->index2 = local_90;
            pFVar13 = (FT_Offset *)0x0;
            uVar12 = local_80;
            if ((int)len_2 != 0x25) {
              uVar12 = 0;
              if (FVar7 == 4 && (int)len_2 == 0x22) {
                uVar12 = local_70;
              }
              pFVar13 = (FT_Offset *)(ulong)local_80;
            }
            pAVar9->x = (FT_Int)pFVar13;
            pAVar9->y = uVar12;
          }
          pcVar8 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&len,pFVar13);
          if (pcVar8 == (char *)0x0) break;
        } while( true );
      }
    }
  }
  else {
    pFVar13 = extraout_RDX_07;
    if (AVar6 == AFM_TOKEN_UNKNOWN) goto LAB_002097e5;
    if (AVar6 != AFM_TOKEN_STARTTRACKKERN) goto LAB_002093f9;
    pAVar2 = parser->FontInfo;
    local_a8 = AFM_VALUE_TYPE_INTEGER;
    FVar7 = afm_parser_read_vals(parser,(AFM_Value)&stack0xffffffffffffff58,1);
    if ((FVar7 == 1) && (-1 < (long)(int)(FT_UInt)len_1)) {
      pAVar2->NumTrackKern = (FT_UInt)len_1;
      pFVar13 = extraout_RDX_10;
      if ((FT_UInt)len_1 != 0) {
        pAVar10 = (AFM_TrackKern)
                  ft_mem_realloc(parser->memory,0x28,0,(long)(int)(FT_UInt)len_1,(void *)0x0,
                                 (FT_Error *)&stack0xffffffffffffff58);
        pAVar2->TrackKerns = pAVar10;
        pFVar13 = extraout_RDX_11;
        AVar14 = local_a8;
        if (local_a8 != AFM_VALUE_TYPE_STRING) goto LAB_002093f9;
      }
      pcVar8 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&len,pFVar13);
      if (pcVar8 != (char *)0x0) {
        local_38 = CONCAT44(local_38._4_4_,0xffffffff);
        len_2 = (FT_Offset)pAVar2;
        do {
          FVar4 = len_2;
          AVar6 = afm_tokenize(pcVar8,len);
          if ((int)AVar6 < 0x4b) {
            if (AVar6 != AFM_TOKEN_TRACKKERN) goto LAB_002097cc;
            iVar5 = (int)local_38 + 1;
            local_38 = CONCAT44(local_38._4_4_,iVar5);
            if (*(int *)(FVar4 + 0x40) <= iVar5) break;
            lVar3 = *(long *)(len_2 + 0x38);
            local_a8 = AFM_VALUE_TYPE_INTEGER;
            local_98 = 2;
            local_88 = 2;
            local_78 = 2;
            local_68 = 2;
            FVar7 = afm_parser_read_vals(parser,(AFM_Value)&stack0xffffffffffffff58,5);
            if (FVar7 != 5) break;
            lVar11 = (long)(int)local_38;
            *(FT_UInt *)(lVar3 + lVar11 * 0x28) = (FT_UInt)len_1;
            *(ulong *)(lVar3 + 8 + lVar11 * 0x28) = CONCAT44(uStack_8c,local_90);
            *(ulong *)(lVar3 + 0x10 + lVar11 * 0x28) = CONCAT44(uStack_7c,local_80);
            *(ulong *)(lVar3 + 0x18 + lVar11 * 0x28) = CONCAT44(uStack_6c,local_70);
            *(undefined8 *)(lVar3 + 0x20 + lVar11 * 0x28) = local_60;
            pFVar13 = extraout_RDX_13;
          }
          else {
            pFVar13 = extraout_RDX_12;
            if (AVar6 != AFM_TOKEN_UNKNOWN) break;
          }
          pcVar8 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&len,pFVar13);
          if (pcVar8 == (char *)0x0) break;
        } while( true );
      }
    }
  }
LAB_00209805:
  AVar14 = 0xa0;
  goto LAB_002093f9;
LAB_002097cc:
  if ((AVar6 - AFM_TOKEN_ENDFONTMETRICS < 2) || (AVar6 == AFM_TOKEN_ENDTRACKKERN)) {
    *(int *)(len_2 + 0x40) = (int)local_38 + 1;
    pFVar13 = extraout_RDX_12;
    goto LAB_002097e5;
  }
  goto LAB_00209805;
LAB_00209799:
  AVar14 = 0xa0;
  if ((7UL >> ((ulong)pFVar13 & 0x3f) & 1) == 0) goto LAB_002093f9;
  uVar12 = (int)local_38 + 1;
  pAVar2->NumKernPair = uVar12;
  qsort(pAVar2->KernPairs,(ulong)uVar12,0x10,afm_compare_kern_pairs);
  pFVar13 = extraout_RDX_14;
LAB_002097e5:
  pcVar8 = afm_parser_next_key((AFM_Parser)parser->stream,(FT_Bool)&local_b0,pFVar13);
  goto LAB_00209464;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  afm_parser_parse( AFM_Parser  parser )
  {
    FT_Memory     memory = parser->memory;
    AFM_FontInfo  fi     = parser->FontInfo;
    FT_Error      error  = FT_ERR( Syntax_Error );
    char*         key;
    FT_Offset     len;
    FT_Int        metrics_sets = 0;


    if ( !fi )
      return FT_THROW( Invalid_Argument );

    key = afm_parser_next_key( parser, 1, &len );
    if ( !key || len != 16                              ||
         ft_strncmp( key, "StartFontMetrics", 16 ) != 0 )
      return FT_THROW( Unknown_File_Format );

    while ( ( key = afm_parser_next_key( parser, 1, &len ) ) != 0 )
    {
      AFM_ValueRec  shared_vals[4];


      switch ( afm_tokenize( key, len ) )
      {
      case AFM_TOKEN_METRICSSETS:
        if ( afm_parser_read_int( parser, &metrics_sets ) )
          goto Fail;

        if ( metrics_sets != 0 && metrics_sets != 2 )
        {
          error = FT_THROW( Unimplemented_Feature );

          goto Fail;
        }
        break;

      case AFM_TOKEN_ISCIDFONT:
        shared_vals[0].type = AFM_VALUE_TYPE_BOOL;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->IsCIDFont = shared_vals[0].u.b;
        break;

      case AFM_TOKEN_FONTBBOX:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[1].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[2].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[3].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 4 ) != 4 )
          goto Fail;

        fi->FontBBox.xMin = shared_vals[0].u.f;
        fi->FontBBox.yMin = shared_vals[1].u.f;
        fi->FontBBox.xMax = shared_vals[2].u.f;
        fi->FontBBox.yMax = shared_vals[3].u.f;
        break;

      case AFM_TOKEN_ASCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Ascender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_DESCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Descender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_STARTCHARMETRICS:
        {
          FT_Int  n = 0;


          if ( afm_parser_read_int( parser, &n ) )
            goto Fail;

          error = afm_parser_skip_section( parser, n,
                                           AFM_TOKEN_ENDCHARMETRICS );
          if ( error )
            return error;
        }
        break;

      case AFM_TOKEN_STARTKERNDATA:
        error = afm_parse_kern_data( parser );
        if ( error )
          goto Fail;
        /* fall through since we only support kern data */

      case AFM_TOKEN_ENDFONTMETRICS:
        return FT_Err_Ok;

      default:
        break;
      }
    }

  Fail:
    FT_FREE( fi->TrackKerns );
    fi->NumTrackKern = 0;

    FT_FREE( fi->KernPairs );
    fi->NumKernPair = 0;

    fi->IsCIDFont = 0;

    return error;
  }